

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

void __thiscall QCborContainerPrivate::appendAsciiString(QCborContainerPrivate *this,QStringView s)

{
  QByteArray *this_00;
  Data *pDVar1;
  iterator pcVar2;
  long length;
  anon_union_8_2_4ee71171_for_Element_0 aVar3;
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_40;
  undefined8 local_38;
  long local_30;
  
  length = s.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->data;
  aVar3.value = (this->data).d.size + 7U & 0x7ffffffffffffff8;
  this->usedData = this->usedData + length + 8;
  QByteArray::resize(this_00,(long)&(aVar3.container)->usedData + length);
  pcVar2 = QByteArray::begin(this_00);
  *(long *)(pcVar2 + (long)aVar3.container) = length;
  local_38 = 0xa00000060;
  local_40.value = aVar3.value;
  QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element_const&>
            ((QPodArrayOps<QtCbor::Element> *)&this->elements,(this->elements).d.size,
             (Element *)&local_40);
  QList<QtCbor::Element>::end(&this->elements);
  pDVar1 = (this->data).d.d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(this_00,(this->data).d.size,KeepSize);
  }
  qt_to_latin1_unchecked
            ((uchar *)((this->data).d.ptr + (long)local_40.container + 8),s.m_data,length);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void QCborContainerPrivate::appendAsciiString(QStringView s)
{
    qsizetype len = s.size();
    QtCbor::Element e;
    e.value = addByteData(nullptr, len);
    e.type = QCborValue::String;
    e.flags = Element::HasByteData | Element::StringIsAscii;
    elements.append(e);

    char *ptr = data.data() + e.value + sizeof(ByteData);
    uchar *l = reinterpret_cast<uchar *>(ptr);
    qt_to_latin1_unchecked(l, s.utf16(), len);
}